

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O0

void __thiscall OpenSSLWrapper::SslConnection::SSLSetShutdown(SslConnection *this,int iState)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lk;
  int iState_local;
  SslConnection *this_local;
  
  lk._M_device._4_4_ = iState;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->m_mxSsl);
  SSL_set_shutdown((SSL *)this->m_ssl,lk._M_device._4_4_);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void SslConnection::SSLSetShutdown(int iState)
    {
        lock_guard<mutex> lk(m_mxSsl);
        SSL_set_shutdown(m_ssl, iState);
    }